

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O0

Vec_Int_t * Gia_ManSimSimulateOne(Gia_Man_t *p,Vec_Int_t *vPat)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *p_00;
  bool bVar8;
  int local_3c;
  int local_38;
  int f;
  int k;
  int i;
  Gia_Obj_t *pObjRo;
  Gia_Obj_t *pObj;
  Vec_Int_t *vPatOut;
  Vec_Int_t *vPat_local;
  Gia_Man_t *p_local;
  
  iVar3 = Vec_IntSize(vPat);
  iVar4 = Gia_ManPiNum(p);
  if (iVar3 % iVar4 != 0) {
    __assert_fail("Vec_IntSize(vPat) % Gia_ManPiNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSim.c"
                  ,0x2c4,"Vec_Int_t *Gia_ManSimSimulateOne(Gia_Man_t *, Vec_Int_t *)");
  }
  pGVar7 = Gia_ManConst0(p);
  *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0xbfffffffffffffff;
  f = 0;
  while( true ) {
    iVar3 = Gia_ManRegNum(p);
    bVar8 = false;
    if (f < iVar3) {
      iVar3 = Gia_ManPiNum(p);
      pObjRo = Gia_ManCi(p,iVar3 + f);
      bVar8 = pObjRo != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    *(ulong *)pObjRo = *(ulong *)pObjRo & 0xbfffffffffffffff;
    f = f + 1;
  }
  p_00 = Vec_IntAlloc(1000);
  local_3c = 0;
  local_38 = 0;
  while( true ) {
    iVar3 = Vec_IntSize(vPat);
    iVar4 = Gia_ManPiNum(p);
    if (iVar3 / iVar4 <= local_3c) break;
    f = 0;
    while( true ) {
      iVar3 = Gia_ManPiNum(p);
      bVar8 = false;
      if (f < iVar3) {
        pObjRo = Gia_ManCi(p,f);
        bVar8 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      uVar6 = Vec_IntEntry(vPat,local_38);
      *(ulong *)pObjRo = *(ulong *)pObjRo & 0xbfffffffffffffff | ((ulong)uVar6 & 1) << 0x3e;
      f = f + 1;
      local_38 = local_38 + 1;
    }
    f = 0;
    while( true ) {
      bVar8 = false;
      if (f < p->nObjs) {
        pObjRo = Gia_ManObj(p,f);
        bVar8 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      iVar3 = Gia_ObjIsAnd(pObjRo);
      if (iVar3 != 0) {
        pGVar7 = Gia_ObjFanin0(pObjRo);
        uVar2 = *(undefined8 *)pGVar7;
        uVar6 = Gia_ObjFaninC0(pObjRo);
        pGVar7 = Gia_ObjFanin1(pObjRo);
        uVar1 = *(undefined8 *)pGVar7;
        uVar5 = Gia_ObjFaninC1(pObjRo);
        *(ulong *)pObjRo =
             *(ulong *)pObjRo & 0xbfffffffffffffff |
             ((ulong)(((uint)((ulong)uVar2 >> 0x3e) & 1 ^ uVar6) &
                     ((uint)((ulong)uVar1 >> 0x3e) & 1 ^ uVar5)) & 1) << 0x3e;
      }
      f = f + 1;
    }
    f = 0;
    while( true ) {
      iVar3 = Vec_IntSize(p->vCos);
      bVar8 = false;
      if (f < iVar3) {
        pObjRo = Gia_ManCo(p,f);
        bVar8 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      pGVar7 = Gia_ObjFanin0(pObjRo);
      uVar2 = *(undefined8 *)pGVar7;
      uVar6 = Gia_ObjFaninC0(pObjRo);
      *(ulong *)pObjRo =
           *(ulong *)pObjRo & 0xbfffffffffffffff |
           ((ulong)((uint)((ulong)uVar2 >> 0x3e) & 1 ^ uVar6) & 1) << 0x3e;
      f = f + 1;
    }
    f = 0;
    while( true ) {
      iVar3 = Gia_ManPoNum(p);
      bVar8 = false;
      if (f < iVar3) {
        pObjRo = Gia_ManCo(p,f);
        bVar8 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      Vec_IntPush(p_00,(uint)((ulong)*(undefined8 *)pObjRo >> 0x3e) & 1);
      f = f + 1;
    }
    f = 0;
    while( true ) {
      iVar3 = Gia_ManRegNum(p);
      bVar8 = false;
      if (f < iVar3) {
        iVar3 = Gia_ManPoNum(p);
        pObjRo = Gia_ManCo(p,iVar3 + f);
        bVar8 = false;
        if (pObjRo != (Gia_Obj_t *)0x0) {
          iVar3 = Gia_ManPiNum(p);
          _k = Gia_ManCi(p,iVar3 + f);
          bVar8 = _k != (Gia_Obj_t *)0x0;
        }
      }
      if (!bVar8) break;
      *(ulong *)_k = *(ulong *)_k & 0xbfffffffffffffff |
                     (ulong)((uint)((ulong)*(undefined8 *)pObjRo >> 0x3e) & 1) << 0x3e;
      f = f + 1;
    }
    local_3c = local_3c + 1;
  }
  iVar3 = Vec_IntSize(vPat);
  if (local_38 != iVar3) {
    __assert_fail("k == Vec_IntSize(vPat)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSim.c"
                  ,0x2d6,"Vec_Int_t *Gia_ManSimSimulateOne(Gia_Man_t *, Vec_Int_t *)");
  }
  f = 0;
  while( true ) {
    bVar8 = false;
    if (f < p->nObjs) {
      pObjRo = Gia_ManObj(p,f);
      bVar8 = pObjRo != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    *(ulong *)pObjRo = *(ulong *)pObjRo & 0xbfffffffffffffff;
    f = f + 1;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManSimSimulateOne( Gia_Man_t * p, Vec_Int_t * vPat )
{
    Vec_Int_t * vPatOut;
    Gia_Obj_t * pObj, * pObjRo;
    int i, k, f;
    assert( Vec_IntSize(vPat) % Gia_ManPiNum(p) == 0 );
    Gia_ManConst0(p)->fMark1 = 0;
    Gia_ManForEachRo( p, pObj, i )
        pObj->fMark1 = 0;
    vPatOut = Vec_IntAlloc( 1000 );
    for ( k = f = 0; f < Vec_IntSize(vPat) / Gia_ManPiNum(p); f++ )
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->fMark1 = Vec_IntEntry( vPat, k++ );
        Gia_ManForEachAnd( p, pObj, i )
            pObj->fMark1 = (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) & (Gia_ObjFanin1(pObj)->fMark1 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( p, pObj, i )
            pObj->fMark1 = (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj));
        Gia_ManForEachPo( p, pObj, i )
            Vec_IntPush( vPatOut, pObj->fMark1 );
        Gia_ManForEachRiRo( p, pObj, pObjRo, i )
            pObjRo->fMark1 = pObj->fMark1;
    }
    assert( k == Vec_IntSize(vPat) );
    Gia_ManForEachObj( p, pObj, i )
        pObj->fMark1 = 0;
    return vPatOut;
}